

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O1

bool double_conversion::RoundWeedCounted
               (Vector<char> buffer,int length,uint64_t rest,uint64_t ten_kappa,uint64_t unit,
               int *kappa)

{
  ulong uVar1;
  undefined4 in_register_00000014;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  
  uVar1 = CONCAT44(in_register_00000014,length);
  pcVar4 = buffer.start_;
  if (ten_kappa < rest - ten_kappa && ten_kappa < rest) {
    if ((uVar1 < rest - uVar1) && (ten_kappa * 2 <= rest + uVar1 * -2)) {
      return true;
    }
    uVar2 = uVar1 - ten_kappa;
    if ((ten_kappa <= uVar1 && uVar2 != 0) && (rest - uVar2 <= uVar2)) {
      uVar3 = buffer.length_;
      pcVar4[(long)(int)uVar3 + -1] = pcVar4[(long)(int)uVar3 + -1] + '\x01';
      if (1 < (int)uVar3) {
        uVar1 = (ulong)uVar3;
        do {
          if (pcVar4[uVar1 - 1] != ':') break;
          pcVar4[uVar1 - 1] = '0';
          pcVar4[uVar1 - 2] = pcVar4[uVar1 - 2] + '\x01';
          uVar1 = uVar1 - 1;
        } while (1 < (long)uVar1);
      }
      if (*pcVar4 != ':') {
        return true;
      }
      *pcVar4 = '1';
      *(int *)unit = *(int *)unit + 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool RoundWeedCounted(Vector<char> buffer,
                             int length,
                             uint64_t rest,
                             uint64_t ten_kappa,
                             uint64_t unit,
                             int* kappa) {
  DOUBLE_CONVERSION_ASSERT(rest < ten_kappa);
  // The following tests are done in a specific order to avoid overflows. They
  // will work correctly with any uint64 values of rest < ten_kappa and unit.
  //
  // If the unit is too big, then we don't know which way to round. For example
  // a unit of 50 means that the real number lies within rest +/- 50. If
  // 10^kappa == 40 then there is no way to tell which way to round.
  if (unit >= ten_kappa) return false;
  // Even if unit is just half the size of 10^kappa we are already completely
  // lost. (And after the previous test we know that the expression will not
  // over/underflow.)
  if (ten_kappa - unit <= unit) return false;
  // If 2 * (rest + unit) <= 10^kappa we can safely round down.
  if ((ten_kappa - rest > rest) && (ten_kappa - 2 * rest >= 2 * unit)) {
    return true;
  }
  // If 2 * (rest - unit) >= 10^kappa, then we can safely round up.
  if ((rest > unit) && (ten_kappa - (rest - unit) <= (rest - unit))) {
    // Increment the last digit recursively until we find a non '9' digit.
    buffer[length - 1]++;
    for (int i = length - 1; i > 0; --i) {
      if (buffer[i] != '0' + 10) break;
      buffer[i] = '0';
      buffer[i - 1]++;
    }
    // If the first digit is now '0'+ 10 we had a buffer with all '9's. With the
    // exception of the first digit all digits are now '0'. Simply switch the
    // first digit to '1' and adjust the kappa. Example: "99" becomes "10" and
    // the power (the kappa) is increased.
    if (buffer[0] == '0' + 10) {
      buffer[0] = '1';
      (*kappa) += 1;
    }
    return true;
  }
  return false;
}